

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_descriptor_multi(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  uint uVar2;
  int iVar3;
  miniscript_node_t *pmVar4;
  
  uVar2 = get_child_list_count(node);
  iVar3 = -2;
  if (0xffffffeb < uVar2 - 0x16) {
    pmVar1 = node->child;
    pmVar4 = pmVar1->next;
    if ((((pmVar4 != (miniscript_node_t *)0x0) && (pmVar1->info == (miniscript_item_t *)0x0)) &&
        (pmVar1->kind == 8)) && ((0 < pmVar1->number && ((uint)pmVar1->number <= uVar2)))) {
      for (; pmVar4 != (miniscript_node_t *)0x0; pmVar4 = pmVar4->next) {
        if (pmVar4->info != (miniscript_item_t *)0x0) {
          return -2;
        }
        if ((pmVar4->kind & 0x20) == 0) {
          return -2;
        }
      }
      node->type_properties = node->info->type_properties;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int verify_descriptor_multi(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *top = NULL;
    struct miniscript_node_t *key = NULL;
    uint32_t require_num = 0;
    uint32_t count = (uint32_t) get_child_list_count(node);
    (void)parent;

    if ((count < 2) || (count - 1 > DESCRIPTOR_MINISCRIPT_MUILTI_MAX))
        return WALLY_EINVAL;

    top = node->child;
    require_num = (uint32_t) top->number;
    if (!top->next || top->info || (top->kind != DESCRIPTOR_KIND_NUMBER) ||
        (top->number <= 0) || (count < require_num))
        return WALLY_EINVAL;

    key = top->next;
    while (key) {
        if (key->info || !(key->kind & DESCRIPTOR_KIND_KEY))
            return WALLY_EINVAL;

        key = key->next;
    }

    node->type_properties = node->info->type_properties;
    return WALLY_OK;
}